

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeMemGetAtomicAccessAttributeExpPrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,ze_device_handle_t hDevice,
          void *ptr,size_t size,ze_memory_atomic_attr_exp_flags_t *pAttr)

{
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (hDevice != (ze_device_handle_t)0x0 && hContext != (ze_context_handle_t)0x0) {
    if (ptr == (void *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (pAttr != (ze_memory_atomic_attr_exp_flags_t *)0x0) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeMemGetAtomicAccessAttributeExpPrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of context
        ze_device_handle_t hDevice,                     ///< [in] device associated with the memory advice
        const void* ptr,                                ///< [in] Pointer to the start of the memory range
        size_t size,                                    ///< [in] Size in bytes of the memory range
        ze_memory_atomic_attr_exp_flags_t* pAttr        ///< [out] Atomic access attributes for the specified range
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == ptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pAttr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }